

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  undefined4 uVar6;
  size_t sVar7;
  size_t sVar8;
  BrotliEncoderDictionary *pBVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  uint64_t uVar12;
  HasherCommon *pHVar13;
  uint8_t *puVar14;
  BrotliDictionary *pBVar15;
  undefined8 uVar16;
  int iVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  size_t sVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  int iVar30;
  uint32_t uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint16_t uVar43;
  long lVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  int last_distance;
  ulong uVar57;
  bool bVar58;
  uint32_t *buckets;
  ulong local_160;
  ulong local_140;
  ulong local_110;
  Command *local_100;
  ulong local_e0;
  int local_d0;
  uint local_cc;
  ulong local_a8;
  ulong local_98;
  uint8_t *s1_orig_3;
  uint8_t *s1_orig_1;
  uint16_t *num;
  
  iVar48 = params->lgwin;
  uVar2 = (position - 7) + num_bytes;
  sVar23 = position;
  if (7 < num_bytes) {
    sVar23 = uVar2;
  }
  lVar24 = 0x200;
  if (params->quality < 9) {
    lVar24 = 0x40;
  }
  sVar7 = params->stream_offset;
  uVar1 = position + num_bytes;
  uVar38 = *last_insert_len;
  sVar8 = (params->dictionary).compound.total_size;
  uVar33 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar33) {
    iVar5 = *dist_cache;
    dist_cache[4] = iVar5 + -1;
    dist_cache[5] = iVar5 + 1;
    dist_cache[6] = iVar5 + -2;
    dist_cache[7] = iVar5 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar5 + 3,iVar5 + -3);
    if (10 < uVar33) {
      iVar5 = dist_cache[1];
      dist_cache[10] = iVar5 + -1;
      dist_cache[0xb] = iVar5 + 1;
      dist_cache[0xc] = iVar5 + -2;
      dist_cache[0xd] = iVar5 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar5 + 3,iVar5 + -3);
    }
  }
  uVar3 = (1L << ((byte)iVar48 & 0x3f)) - 0x10;
  uVar21 = lVar24 + position;
  lVar25 = sVar8 + 1;
  local_100 = commands;
LAB_0034d8f6:
LAB_0034d903:
  uVar20 = position;
  if (uVar1 <= uVar20 + 8) {
    *last_insert_len = (uVar38 + uVar1) - uVar20;
    *num_commands = *num_commands + ((long)local_100 - (long)commands >> 4);
    return;
  }
  uVar47 = uVar3;
  if (uVar20 < uVar3) {
    uVar47 = uVar20;
  }
  uVar40 = sVar7 + uVar20;
  if (uVar3 <= sVar7 + uVar20) {
    uVar40 = uVar3;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_cc = 0;
    local_98 = 0;
    goto LAB_0034d9aa;
  }
  if (uVar20 == 0) {
    local_98 = 0;
LAB_0034d97a:
    uVar26 = 0;
  }
  else {
    local_98 = (ulong)ringbuffer[uVar20 - 1 & ringbuffer_mask];
    if (uVar20 == 1) goto LAB_0034d97a;
    uVar26 = (ulong)ringbuffer[uVar20 - 2 & ringbuffer_mask];
  }
  local_cc = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar26 + 0x100] | literal_context_lut[local_98]];
LAB_0034d9aa:
  uVar34 = uVar1 - uVar20;
  pBVar9 = (params->dictionary).contextual.dict[local_cc];
  uVar26 = (params->dist).max_distance;
  puVar10 = (hasher->privat)._H5.buckets_;
  puVar11 = (hasher->privat)._H6.buckets_;
  uVar18 = uVar20 & ringbuffer_mask;
  puVar19 = (ulong *)(ringbuffer + uVar18);
  uVar50 = 0x7e4;
  uVar46 = 0;
  uVar51 = 0;
  uVar57 = 0;
  uVar37 = 0;
  do {
    if (uVar57 == (long)(hasher->privat)._H6.num_last_distances_to_check_) {
      uVar57 = (hasher->privat)._H5.block_size_;
      uVar12 = (hasher->privat)._H6.hash_mul_;
      uVar27 = *puVar19 * uVar12 >> 0x31;
      lVar54 = uVar27 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      uVar4 = *(ushort *)((long)puVar10 + uVar27 * 2);
      uVar56 = (ulong)uVar4;
      uVar35 = 0;
      if (uVar57 <= uVar56) {
        uVar35 = uVar56 - uVar57;
      }
      uVar33 = (hasher->privat)._H6.block_mask_;
      do {
        uVar29 = uVar37;
        local_e0 = uVar50;
        local_160 = uVar46;
        uVar36 = uVar51;
        uVar55 = uVar29 + uVar18;
        do {
          do {
            do {
              if (uVar56 <= uVar35) {
LAB_0034dcca:
                puVar11[lVar54 + (ulong)(uVar33 & uVar4)] = (uint32_t)uVar20;
                *(ushort *)((long)puVar10 + uVar27 * 2) = uVar4 + 1;
                if (local_e0 != 0x7e4) {
                  iVar48 = 0;
                  goto LAB_0034df82;
                }
                pHVar13 = (hasher->privat)._H6.common_;
                uVar47 = pHVar13->dict_num_lookups;
                local_140 = pHVar13->dict_num_matches;
                if (local_140 < uVar47 >> 7) goto LAB_0034df91;
                uVar51 = (ulong)((uint)((int)*puVar19 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                puVar14 = pBVar9->hash_table_lengths;
                iVar48 = 0;
                local_e0 = 0x7e4;
                lVar54 = 0;
                goto LAB_0034dd94;
              }
              uVar56 = uVar56 - 1;
              uVar46 = uVar20 - puVar11[lVar54 + (ulong)((uint)uVar56 & uVar33)];
              if (uVar47 < uVar46) goto LAB_0034dcca;
            } while (ringbuffer_mask < uVar55);
            uVar50 = (ulong)(puVar11[lVar54 + (ulong)((uint)uVar56 & uVar33)] &
                            (uint)ringbuffer_mask);
            uVar51 = uVar50 + uVar29;
          } while (((ringbuffer_mask < uVar51) || (ringbuffer[uVar55] != ringbuffer[uVar51])) ||
                  (*(int *)(ringbuffer + uVar50) != (int)*puVar19));
          lVar44 = 0;
          uVar51 = uVar34 - 4;
LAB_0034dc57:
          if (uVar51 < 8) {
            for (; ((uVar20 - uVar1) + lVar44 != -4 &&
                   (ringbuffer[lVar44 + uVar50 + 4] == *(uint8_t *)((long)puVar19 + lVar44 + 4)));
                lVar44 = lVar44 + 1) {
            }
          }
          else {
            uVar37 = *(ulong *)((long)puVar19 + lVar44 + 4);
            if (uVar37 == *(ulong *)(ringbuffer + lVar44 + uVar50 + 4)) goto code_r0x0034dc6a;
            uVar37 = *(ulong *)(ringbuffer + lVar44 + uVar50 + 4) ^ uVar37;
            uVar51 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
              }
            }
            lVar44 = lVar44 + (uVar51 >> 3 & 0x1fffffff);
          }
          uVar51 = lVar44 + 4;
          iVar48 = 0x1f;
          if ((uint)uVar46 != 0) {
            for (; (uint)uVar46 >> iVar48 == 0; iVar48 = iVar48 + -1) {
            }
          }
          uVar50 = (ulong)(iVar48 * -0x1e + 0x780) + uVar51 * 0x87;
          uVar37 = uVar51;
        } while (uVar50 <= local_e0);
      } while( true );
    }
    uVar35 = (ulong)dist_cache[uVar57];
    if (((uVar35 <= uVar47) && (uVar20 - uVar35 < uVar20)) && (uVar37 + uVar18 <= ringbuffer_mask))
    {
      uVar27 = uVar20 - uVar35 & ringbuffer_mask;
      uVar56 = uVar27 + uVar37;
      if ((uVar56 <= ringbuffer_mask) && (ringbuffer[uVar37 + uVar18] == ringbuffer[uVar56])) {
        puVar28 = (ulong *)(ringbuffer + uVar27);
        lVar54 = 0;
        puVar39 = puVar19;
        uVar56 = uVar34;
LAB_0034da6c:
        if (uVar56 < 8) {
          for (uVar27 = 0;
              (uVar56 != uVar27 &&
              (*(char *)((long)puVar28 + uVar27) == *(char *)((long)puVar39 + uVar27)));
              uVar27 = uVar27 + 1) {
          }
        }
        else {
          if (*puVar39 == *puVar28) goto code_r0x0034da7e;
          uVar27 = *puVar28 ^ *puVar39;
          uVar56 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
            }
          }
          uVar27 = uVar56 >> 3 & 0x1fffffff;
        }
        uVar27 = uVar27 - lVar54;
        if (((2 < uVar27) || ((uVar57 < 2 && (uVar27 == 2)))) &&
           (uVar56 = uVar27 * 0x87 + 0x78f, uVar50 < uVar56)) {
          if (uVar57 != 0) {
            uVar56 = uVar56 - ((0x1ca10U >> ((byte)uVar57 & 0xe) & 0xe) + 0x27);
          }
          if (uVar50 < uVar56) {
            uVar51 = uVar27;
            uVar46 = uVar35;
            uVar50 = uVar56;
            uVar37 = uVar27;
          }
        }
      }
    }
    uVar57 = uVar57 + 1;
  } while( true );
LAB_0034dd94:
  if (lVar54 == 2) goto LAB_0034df82;
  uVar47 = uVar47 + 1;
  pHVar13->dict_num_lookups = uVar47;
  bVar22 = puVar14[uVar51];
  uVar46 = (ulong)bVar22;
  if ((uVar46 != 0) && (uVar46 <= uVar34)) {
    pBVar15 = pBVar9->words;
    puVar28 = (ulong *)(pBVar15->data +
                       (ulong)pBVar15->offsets_by_length[uVar46] +
                       pBVar9->hash_table_words[uVar51] * uVar46);
    lVar44 = 0;
    uVar50 = uVar46;
    puVar39 = puVar19;
LAB_0034ddfc:
    if (uVar50 < 8) {
      for (uVar50 = 0;
          ((bVar22 & 7) != uVar50 &&
          (*(char *)((long)puVar39 + uVar50) == *(char *)((long)puVar28 + uVar50)));
          uVar50 = uVar50 + 1) {
      }
    }
    else {
      if (*puVar28 == *puVar39) goto code_r0x0034de0e;
      uVar37 = *puVar39 ^ *puVar28;
      uVar50 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
        }
      }
      uVar50 = uVar50 >> 3 & 0x1fffffff;
    }
    uVar50 = uVar50 - lVar44;
    if (((uVar50 != 0) && (uVar46 < pBVar9->cutoffTransformsCount + uVar50)) &&
       (uVar46 = (ulong)pBVar9->hash_table_words[uVar51] + uVar40 + lVar25 +
                 ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                ((char)(uVar46 - uVar50) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar46 - uVar50) * 4 << (pBVar15->size_bits_by_length[uVar46] & 0x3f)),
       uVar46 <= uVar26)) {
      iVar5 = 0x1f;
      if ((uint)uVar46 != 0) {
        for (; (uint)uVar46 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      uVar37 = (uVar50 * 0x87 - (ulong)(uint)(iVar5 * 0x1e)) + 0x780;
      if (local_e0 <= uVar37) {
        iVar48 = (uint)bVar22 - (int)uVar50;
        local_140 = local_140 + 1;
        pHVar13->dict_num_matches = local_140;
        local_e0 = uVar37;
        uVar36 = uVar50;
        local_160 = uVar46;
      }
    }
  }
  lVar54 = lVar54 + 1;
  uVar51 = uVar51 + 1;
  goto LAB_0034dd94;
LAB_0034df82:
  if (local_e0 < 0x7e5) {
LAB_0034df91:
    uVar38 = uVar38 + 1;
    position = uVar20 + 1;
    if (uVar21 < position) {
      if (uVar21 + (uint)((int)lVar24 * 4) < position) {
        uVar47 = uVar20 + 0x11;
        if (uVar2 <= uVar20 + 0x11) {
          uVar47 = uVar2;
        }
        for (; position < uVar47; position = position + 4) {
          uVar20 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar12 >> 0x31;
          uVar4 = *(ushort *)((long)puVar10 + uVar20 * 2);
          uVar33 = (hasher->privat)._H6.block_mask_;
          bVar22 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar10 + uVar20 * 2) = uVar4 + 1;
          puVar11[(uVar20 << (bVar22 & 0x3f)) + (ulong)(uVar33 & uVar4)] = (uint32_t)position;
          uVar38 = uVar38 + 4;
        }
      }
      else {
        uVar47 = uVar20 + 9;
        if (uVar2 <= uVar20 + 9) {
          uVar47 = uVar2;
        }
        for (; position < uVar47; position = position + 2) {
          uVar20 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar12 >> 0x31;
          uVar4 = *(ushort *)((long)puVar10 + uVar20 * 2);
          uVar33 = (hasher->privat)._H6.block_mask_;
          bVar22 = *(byte *)((long)&hasher->privat + 0x1c);
          *(ushort *)((long)puVar10 + uVar20 * 2) = uVar4 + 1;
          puVar11[(uVar20 << (bVar22 & 0x3f)) + (ulong)(uVar33 & uVar4)] = (uint32_t)position;
          uVar38 = uVar38 + 2;
        }
      }
    }
    goto LAB_0034d903;
  }
  iVar5 = (hasher->privat)._H6.num_last_distances_to_check_;
  uVar33 = (hasher->privat)._H6.block_mask_;
  uVar6 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
  local_d0 = 0;
  uVar21 = uVar38;
LAB_0034e0af:
  uVar47 = uVar34 - 1;
  uVar40 = uVar36 - 1;
  if (uVar47 <= uVar36 - 1) {
    uVar40 = uVar47;
  }
  if (4 < params->quality) {
    uVar40 = 0;
  }
  uVar51 = uVar20 + 1;
  uVar46 = uVar3;
  if (uVar51 < uVar3) {
    uVar46 = uVar51;
  }
  local_a8 = sVar7 + uVar20 + 1;
  if (uVar3 <= local_a8) {
    local_a8 = uVar3;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    local_cc = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[local_98 + 0x100] |
                      literal_context_lut[ringbuffer[uVar20 & ringbuffer_mask]]];
    local_98 = (ulong)ringbuffer[uVar20 & ringbuffer_mask];
  }
  pBVar9 = (params->dictionary).contextual.dict[local_cc];
  uVar35 = uVar51 & ringbuffer_mask;
  puVar19 = (ulong *)(ringbuffer + uVar35);
  uVar37 = 0x7e4;
  uVar18 = 0;
  uVar50 = 0;
  uVar56 = 0;
  do {
    if (uVar56 == (long)iVar5) {
      uVar27 = *puVar19 * uVar12 >> 0x31;
      lVar54 = uVar27 << ((byte)uVar6 & 0x3f);
      uVar4 = *(ushort *)((long)puVar10 + uVar27 * 2);
      uVar55 = (ulong)uVar4;
      uVar56 = 0;
      if (uVar57 <= uVar55) {
        uVar56 = uVar55 - uVar57;
      }
      do {
        uVar42 = uVar18;
        uVar52 = uVar37;
        uVar49 = uVar50;
        uVar41 = uVar40;
        uVar29 = uVar35 + uVar41;
        do {
          do {
            do {
              if (uVar55 <= uVar56) {
LAB_0034e41a:
                puVar11[lVar54 + (ulong)(uVar33 & uVar4)] = (uint32_t)uVar51;
                *(ushort *)((long)puVar10 + uVar27 * 2) = uVar4 + 1;
                iVar30 = 0;
                if (uVar52 != 0x7e4) goto LAB_0034e6ce;
                pHVar13 = (hasher->privat)._H6.common_;
                uVar40 = pHVar13->dict_num_lookups;
                local_110 = pHVar13->dict_num_matches;
                uVar52 = 0x7e4;
                if (local_110 < uVar40 >> 7) goto LAB_0034e6ce;
                uVar46 = (ulong)((uint)((int)*puVar19 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                puVar14 = pBVar9->hash_table_lengths;
                iVar30 = 0;
                lVar54 = 0;
                goto LAB_0034e521;
              }
              uVar55 = uVar55 - 1;
              uVar18 = uVar51 - puVar11[lVar54 + (ulong)((uint)uVar55 & uVar33)];
              if (uVar46 < uVar18) goto LAB_0034e41a;
            } while (ringbuffer_mask < uVar29);
            uVar50 = (ulong)(puVar11[lVar54 + (ulong)((uint)uVar55 & uVar33)] &
                            (uint)ringbuffer_mask);
            uVar40 = uVar50 + uVar41;
          } while (((ringbuffer_mask < uVar40) || (ringbuffer[uVar29] != ringbuffer[uVar40])) ||
                  (*(int *)(ringbuffer + uVar50) != (int)*puVar19));
          lVar44 = 0;
          uVar40 = uVar34 - 5;
LAB_0034e3ad:
          if (uVar40 < 8) {
            for (; (bVar58 = uVar40 != 0, uVar40 = uVar40 - 1, bVar58 &&
                   (ringbuffer[lVar44 + uVar50 + 4] == *(uint8_t *)((long)puVar19 + lVar44 + 4)));
                lVar44 = lVar44 + 1) {
            }
          }
          else {
            uVar37 = *(ulong *)((long)puVar19 + lVar44 + 4);
            if (uVar37 == *(ulong *)(ringbuffer + lVar44 + uVar50 + 4)) goto code_r0x0034e3c0;
            uVar37 = *(ulong *)(ringbuffer + lVar44 + uVar50 + 4) ^ uVar37;
            uVar40 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            lVar44 = lVar44 + (uVar40 >> 3 & 0x1fffffff);
          }
          uVar40 = lVar44 + 4;
          iVar30 = 0x1f;
          if ((uint)uVar18 != 0) {
            for (; (uint)uVar18 >> iVar30 == 0; iVar30 = iVar30 + -1) {
            }
          }
          uVar37 = (ulong)(iVar30 * -0x1e + 0x780) + uVar40 * 0x87;
          uVar50 = uVar40;
        } while (uVar37 <= uVar52);
      } while( true );
    }
    uVar27 = (ulong)dist_cache[uVar56];
    if (((uVar27 <= uVar46) && (uVar51 - uVar27 < uVar51)) && (uVar35 + uVar40 <= ringbuffer_mask))
    {
      uVar29 = uVar51 - uVar27 & ringbuffer_mask;
      uVar55 = uVar29 + uVar40;
      if ((uVar55 <= ringbuffer_mask) && (ringbuffer[uVar35 + uVar40] == ringbuffer[uVar55])) {
        puVar28 = (ulong *)(ringbuffer + uVar29);
        lVar54 = 0;
        uVar55 = uVar47;
        puVar39 = puVar19;
LAB_0034e1f2:
        if (uVar55 < 8) {
          for (uVar29 = 0;
              (uVar55 != uVar29 &&
              (*(char *)((long)puVar28 + uVar29) == *(char *)((long)puVar39 + uVar29)));
              uVar29 = uVar29 + 1) {
          }
        }
        else {
          if (*puVar39 == *puVar28) goto code_r0x0034e204;
          uVar29 = *puVar28 ^ *puVar39;
          uVar55 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
            }
          }
          uVar29 = uVar55 >> 3 & 0x1fffffff;
        }
        uVar29 = uVar29 - lVar54;
        if (((2 < uVar29) || ((uVar56 < 2 && (uVar29 == 2)))) &&
           (uVar55 = uVar29 * 0x87 + 0x78f, uVar37 < uVar55)) {
          if (uVar56 != 0) {
            uVar55 = uVar55 - ((0x1ca10U >> ((byte)uVar56 & 0xe) & 0xe) + 0x27);
          }
          if (uVar37 < uVar55) {
            uVar40 = uVar29;
            uVar50 = uVar29;
            uVar37 = uVar55;
            uVar18 = uVar27;
          }
        }
      }
    }
    uVar56 = uVar56 + 1;
  } while( true );
LAB_0034e521:
  if (lVar54 == 2) goto LAB_0034e6ce;
  uVar40 = uVar40 + 1;
  pHVar13->dict_num_lookups = uVar40;
  bVar22 = puVar14[uVar46];
  uVar34 = (ulong)bVar22;
  if ((uVar34 != 0) && (uVar34 <= uVar47)) {
    pBVar15 = pBVar9->words;
    puVar28 = (ulong *)(pBVar15->data +
                       (ulong)pBVar15->offsets_by_length[uVar34] +
                       pBVar9->hash_table_words[uVar46] * uVar34);
    lVar44 = 0;
    puVar39 = puVar19;
    uVar50 = uVar34;
LAB_0034e59d:
    if (uVar50 < 8) {
      for (uVar50 = 0;
          ((bVar22 & 7) != uVar50 &&
          (*(char *)((long)puVar39 + uVar50) == *(char *)((long)puVar28 + uVar50)));
          uVar50 = uVar50 + 1) {
      }
    }
    else {
      if (*puVar28 == *puVar39) goto code_r0x0034e5af;
      uVar37 = *puVar39 ^ *puVar28;
      uVar50 = 0;
      if (uVar37 != 0) {
        for (; (uVar37 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
        }
      }
      uVar50 = uVar50 >> 3 & 0x1fffffff;
    }
    uVar50 = uVar50 - lVar44;
    if (((uVar50 != 0) && (uVar34 < pBVar9->cutoffTransformsCount + uVar50)) &&
       (uVar34 = (ulong)pBVar9->hash_table_words[uVar46] + lVar25 + local_a8 +
                 ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                ((char)(uVar34 - uVar50) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar34 - uVar50) * 4 << (pBVar15->size_bits_by_length[uVar34] & 0x3f)),
       uVar34 <= uVar26)) {
      iVar17 = 0x1f;
      if ((uint)uVar34 != 0) {
        for (; (uint)uVar34 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      uVar37 = (uVar50 * 0x87 - (ulong)(uint)(iVar17 * 0x1e)) + 0x780;
      if (uVar52 <= uVar37) {
        iVar30 = (uint)bVar22 - (int)uVar50;
        local_110 = local_110 + 1;
        pHVar13->dict_num_matches = local_110;
        uVar52 = uVar37;
        uVar42 = uVar34;
        uVar49 = uVar50;
      }
    }
  }
  lVar54 = lVar54 + 1;
  uVar46 = uVar46 + 1;
  goto LAB_0034e521;
LAB_0034e6ce:
  if (uVar52 < local_e0 + 0xaf) {
    uVar40 = uVar21;
    uVar42 = local_160;
    uVar51 = uVar20;
    uVar49 = uVar36;
    iVar30 = iVar48;
    local_a8 = uVar20 + sVar7;
    if (uVar3 <= uVar20 + sVar7) {
      local_a8 = uVar3;
    }
    goto LAB_0034e76c;
  }
  uVar40 = uVar38 + 4;
  if (local_d0 == 3) goto LAB_0034e76c;
  uVar40 = uVar21 + 1;
  local_d0 = local_d0 + 1;
  uVar46 = uVar20 + 9;
  uVar36 = uVar49;
  uVar21 = uVar40;
  uVar34 = uVar47;
  uVar20 = uVar51;
  local_160 = uVar42;
  local_e0 = uVar52;
  iVar48 = iVar30;
  if (uVar1 <= uVar46) goto LAB_0034e76c;
  goto LAB_0034e0af;
LAB_0034e76c:
  local_a8 = local_a8 + sVar8;
  if (local_a8 < uVar42) {
LAB_0034e78e:
    uVar38 = uVar42 + 0xf;
  }
  else {
    if (uVar42 == (long)*dist_cache) {
      uVar38 = 0;
      goto LAB_0034e820;
    }
    uVar38 = 1;
    if (uVar42 != (long)dist_cache[1]) {
      uVar38 = (uVar42 + 3) - (long)*dist_cache;
      if (uVar38 < 7) {
        bVar22 = (byte)((int)uVar38 << 2);
        uVar33 = 0x9750468;
      }
      else {
        uVar38 = (uVar42 + 3) - (long)dist_cache[1];
        if (6 < uVar38) {
          uVar38 = 2;
          if ((uVar42 != (long)dist_cache[2]) && (uVar38 = 3, uVar42 != (long)dist_cache[3]))
          goto LAB_0034e78e;
          goto LAB_0034e792;
        }
        bVar22 = (byte)((int)uVar38 << 2);
        uVar33 = 0xfdb1ace;
      }
      uVar38 = (ulong)(uVar33 >> (bVar22 & 0x1f) & 0xf);
    }
  }
LAB_0034e792:
  if ((uVar42 <= local_a8) && (uVar38 != 0)) {
    dist_cache[3] = dist_cache[2];
    uVar16 = *(undefined8 *)dist_cache;
    *(undefined8 *)(dist_cache + 1) = uVar16;
    iVar48 = (int)uVar42;
    *dist_cache = iVar48;
    uVar33 = (uint)(hasher->privat)._H35.hb.next_ix;
    if (4 < (int)uVar33) {
      dist_cache[4] = iVar48 + -1;
      dist_cache[5] = iVar48 + 1;
      dist_cache[6] = iVar48 + -2;
      dist_cache[7] = iVar48 + 2;
      dist_cache[8] = iVar48 + -3;
      dist_cache[9] = iVar48 + 3;
      if (10 < uVar33) {
        iVar48 = (int)uVar16;
        dist_cache[10] = iVar48 + -1;
        dist_cache[0xb] = iVar48 + 1;
        dist_cache[0xc] = iVar48 + -2;
        dist_cache[0xd] = iVar48 + 2;
        *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar48 + 3,iVar48 + -3);
      }
    }
  }
LAB_0034e820:
  uVar33 = (uint)uVar40;
  local_100->insert_len_ = uVar33;
  local_100->copy_len_ = iVar30 << 0x19 | (uint)uVar49;
  uVar20 = (ulong)(params->dist).num_direct_distance_codes;
  uVar21 = uVar20 + 0x10;
  uVar31 = 0;
  if (uVar21 <= uVar38) {
    uVar53 = (params->dist).distance_postfix_bits;
    bVar22 = (byte)uVar53;
    uVar20 = ((uVar38 - uVar20) + (4L << (bVar22 & 0x3f))) - 0x10;
    uVar45 = 0x1f;
    uVar32 = (uint)uVar20;
    if (uVar32 != 0) {
      for (; uVar32 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar45 = (uVar45 ^ 0xffffffe0) + 0x1f;
    uVar47 = (ulong)((uVar20 >> ((ulong)uVar45 & 0x3f) & 1) != 0);
    lVar54 = (ulong)uVar45 - (ulong)uVar53;
    uVar38 = (~(-1 << (bVar22 & 0x1f)) & uVar32) + uVar21 +
             (uVar47 + lVar54 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar54 * 0x400;
    uVar31 = (uint32_t)(uVar20 - (uVar47 + 2 << ((byte)uVar45 & 0x3f)) >> (bVar22 & 0x3f));
  }
  local_100->dist_prefix_ = (uint16_t)uVar38;
  local_100->dist_extra_ = uVar31;
  if (5 < uVar40) {
    if (uVar40 < 0x82) {
      uVar33 = 0x1f;
      uVar53 = (uint)(uVar40 - 2);
      if (uVar53 != 0) {
        for (; uVar53 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar33 = (int)(uVar40 - 2 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar33 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar40 < 0x842) {
      uVar53 = 0x1f;
      if (uVar33 - 0x42 != 0) {
        for (; uVar33 - 0x42 >> uVar53 == 0; uVar53 = uVar53 - 1) {
        }
      }
      uVar33 = (uVar53 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar33 = 0x15;
      if (0x1841 < uVar40) {
        uVar33 = (uint)(ushort)(0x17 - (uVar40 < 0x5842));
      }
    }
  }
  uVar53 = iVar30 + (uint)uVar49;
  if (uVar53 < 10) {
    uVar21 = (ulong)(uVar53 - 2);
  }
  else if (uVar53 < 0x86) {
    uVar53 = uVar53 - 6;
    uVar45 = 0x1f;
    if (uVar53 != 0) {
      for (; uVar53 >> uVar45 == 0; uVar45 = uVar45 - 1) {
      }
    }
    uVar21 = (ulong)((uVar53 >> ((char)(uVar45 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
                     (uVar45 ^ 0xffffffe0) * 2 + 0x42);
  }
  else {
    uVar21 = 0x17;
    if (uVar53 < 0x846) {
      uVar45 = 0x1f;
      if (uVar53 - 0x46 != 0) {
        for (; uVar53 - 0x46 >> uVar45 == 0; uVar45 = uVar45 - 1) {
        }
      }
      uVar21 = (ulong)((uVar45 ^ 0xffe0) + 0x2c);
    }
  }
  uVar4 = (ushort)uVar21;
  uVar43 = (uVar4 & 7) + ((ushort)uVar33 & 7) * 8;
  if ((((uVar38 & 0x3ff) == 0) && ((ushort)uVar33 < 8)) && (uVar4 < 0x10)) {
    if (7 < uVar4) {
      uVar43 = uVar43 + 0x40;
    }
  }
  else {
    iVar48 = ((uVar33 & 0xffff) >> 3) * 3 + (int)((uVar21 & 0xffff) >> 3);
    uVar43 = uVar43 + ((ushort)(0x520d40 >> ((char)iVar48 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar48 * 0x40 + 0x40;
  }
  local_100->cmd_prefix_ = uVar43;
  *num_literals = *num_literals + uVar40;
  position = uVar49 + uVar51;
  uVar38 = sVar23;
  if (position < sVar23) {
    uVar38 = position;
  }
  uVar20 = uVar51 + 2;
  if (uVar42 < uVar49 >> 2) {
    uVar21 = position + uVar42 * -4;
    if (uVar21 < uVar20) {
      uVar21 = uVar20;
    }
    uVar20 = uVar21;
    if (uVar38 < uVar21) {
      uVar20 = uVar38;
    }
  }
  uVar21 = uVar51 + lVar24 + uVar49 * 2;
  local_100 = local_100 + 1;
  for (; uVar20 < uVar38; uVar20 = uVar20 + 1) {
    uVar47 = *(long *)(ringbuffer + (uVar20 & ringbuffer_mask)) * (hasher->privat)._H6.hash_mul_ >>
             0x31;
    uVar4 = *(ushort *)((long)puVar10 + uVar47 * 2);
    uVar33 = (hasher->privat)._H6.block_mask_;
    bVar22 = *(byte *)((long)&hasher->privat + 0x1c);
    *(ushort *)((long)puVar10 + uVar47 * 2) = uVar4 + 1;
    puVar11[(uVar47 << (bVar22 & 0x3f)) + (ulong)(uVar33 & uVar4)] = (uint32_t)uVar20;
  }
  uVar38 = 0;
  goto LAB_0034d8f6;
code_r0x0034e5af:
  puVar28 = puVar28 + 1;
  puVar39 = puVar39 + 1;
  uVar50 = uVar50 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_0034e59d;
code_r0x0034e3c0:
  uVar40 = uVar40 - 8;
  lVar44 = lVar44 + 8;
  goto LAB_0034e3ad;
code_r0x0034e204:
  puVar39 = puVar39 + 1;
  puVar28 = puVar28 + 1;
  uVar55 = uVar55 - 8;
  lVar54 = lVar54 + -8;
  goto LAB_0034e1f2;
code_r0x0034de0e:
  puVar28 = puVar28 + 1;
  puVar39 = puVar39 + 1;
  uVar50 = uVar50 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_0034ddfc;
code_r0x0034dc6a:
  uVar51 = uVar51 - 8;
  lVar44 = lVar44 + 8;
  goto LAB_0034dc57;
code_r0x0034da7e:
  puVar39 = puVar39 + 1;
  puVar28 = puVar28 + 1;
  uVar56 = uVar56 - 8;
  lVar54 = lVar54 + -8;
  goto LAB_0034da6c;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}